

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplePursuit.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_6fc9f::MpPlugIn::~MpPlugIn(MpPlugIn *this)

{
  ~MpPlugIn(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

void open (void)
        {
            // create the wanderer, saving a pointer to it
            wanderer = new MpWanderer;
            allMP.push_back (wanderer);

            // create the specified number of pursuers, save pointers to them
            const int pursuerCount = 30;
            for (int i = 0; i < pursuerCount; i++)
                allMP.push_back (new MpPursuer (wanderer));
            pBegin = allMP.begin() + 1;  // iterator pointing to first pursuer
            pEnd = allMP.end();          // iterator pointing to last pursuer

            // initialize camera
            OpenSteerDemo::selectedVehicle = wanderer;
            OpenSteerDemo::camera.mode = Camera::cmStraightDown;
            OpenSteerDemo::camera.fixedDistDistance = OpenSteerDemo::cameraTargetDistance;
            OpenSteerDemo::camera.fixedDistVOffset = OpenSteerDemo::camera2dElevation;
        }